

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

double * __thiscall Matrix<double,_3,_3>::operator()(Matrix<double,_3,_3> *this,int row,int col)

{
  ostream *this_00;
  int local_1c;
  int position;
  int col_local;
  int row_local;
  Matrix<double,_3,_3> *this_local;
  
  if ((row < this->rows) && (col < this->cols)) {
    local_1c = row * this->cols + col;
    if (this->cols == 1) {
      local_1c = row;
    }
    if (this->rows == 1) {
      local_1c = col;
    }
    return this->data + local_1c;
  }
  this_00 = std::operator<<((ostream *)&std::cerr,
                            "assertion occurred! fail to find the element, please check");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

Type & Matrix<Type, _0, _1>::operator()(const int row, const int col) const
{
    if(row >= this->rows || col >= this->cols)
    {
        cerr << "assertion occurred! fail to find the element, please check" << endl;
        exit(-1);
    }

    // to get the position of the element
    int position = row * this->cols + col;

    // vector
    if(this->cols == 1)
        position = row;
    if(this->rows == 1)
        position = col;

    return (this->data[position]);
}